

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

string * __thiscall
flatbuffers::python::PythonGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  size_t sVar2;
  char *__s;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_ARRAY || BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if (BVar1 == BASE_TYPE_ARRAY) {
      BVar1 = (field->value).type.element;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,
               *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                         (ulong)BVar1 * 8),&local_41);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (__return_storage_ptr__,&this->namer_,(string *)local_40,
               (ulong)(this->namer_).super_Namer.config_.methods);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  else {
    if (BVar1 == BASE_TYPE_STRUCT) {
      __s = "UOffsetTRelative";
      if (((field->value).type.struct_def)->fixed != false) {
        __s = "Struct";
      }
    }
    else {
      __s = "UOffsetTRelative";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const FieldDef &field) const {
    return (IsScalar(field.value.type.base_type) || IsArray(field.value.type))
               ? namer_.Method(GenTypeBasic(field.value.type))
               : (IsStruct(field.value.type) ? "Struct" : "UOffsetTRelative");
  }